

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_reporter.c
# Opt level: O0

void text_reporter_start_suite(TestReporter *reporter,char *name,int number_of_tests)

{
  _Bool _Var1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  int in_EDX;
  TestReporter *in_RDI;
  TextMemo *memo;
  char *in_stack_ffffffffffffffd8;
  CgreenBreadcrumb *breadcrumb;
  TestReporter *reporter_00;
  
  reporter_00 = (TestReporter *)in_RDI->memo;
  in_RDI->passes = 0;
  in_RDI->failures = 0;
  in_RDI->skips = 0;
  in_RDI->exceptions = 0;
  reporter_start_test(reporter_00,in_stack_ffffffffffffffd8);
  iVar2 = get_breadcrumb_depth(in_RDI->breadcrumb);
  if (iVar2 == 1) {
    _Var1 = have_quiet_mode(in_RDI);
    if (!_Var1) {
      _Var1 = inhibit_start_suite_message(in_RDI);
      if (!_Var1) {
        breadcrumb = (CgreenBreadcrumb *)reporter_00->destroy;
        pcVar3 = get_current_from_breadcrumb(breadcrumb);
        pcVar4 = "s";
        if (in_EDX == 1) {
          pcVar4 = "";
        }
        (*(code *)breadcrumb)("Running \"%s\" (%d test%s)...\n",pcVar3,in_EDX,pcVar4);
      }
    }
    fflush(_stdout);
  }
  return;
}

Assistant:

static void text_reporter_start_suite(TestReporter *reporter, const char *name,
        const int number_of_tests) {
    TextMemo *memo = (TextMemo *)reporter->memo;

    reporter->passes = 0;
    reporter->failures = 0;
    reporter->skips = 0;
    reporter->exceptions = 0;

    reporter_start_test(reporter, name);
    if (get_breadcrumb_depth((CgreenBreadcrumb *) reporter->breadcrumb) == 1) {
        if (!have_quiet_mode(reporter) && !inhibit_start_suite_message(reporter))
            memo->printer("Running \"%s\" (%d test%s)...\n",
                          get_current_from_breadcrumb((CgreenBreadcrumb *) reporter->breadcrumb),
                          number_of_tests,
                          number_of_tests==1?"":"s");
        fflush(stdout);
    }
}